

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

bool tcmalloc::CentralFreeList::EvictRandomSizeClass(int locked_size_class,bool force)

{
  int iVar1;
  uint uVar2;
  CentralFreeList *pCVar3;
  uint local_18;
  int t;
  bool force_local;
  int locked_size_class_local;
  
  iVar1 = EvictRandomSizeClass::race_counter;
  local_18 = EvictRandomSizeClass::race_counter;
  EvictRandomSizeClass::race_counter = EvictRandomSizeClass::race_counter + 1;
  uVar2 = Static::num_size_classes();
  if (uVar2 <= (uint)iVar1) {
    for (; uVar2 = Static::num_size_classes(), uVar2 <= local_18; local_18 = local_18 - uVar2) {
      uVar2 = Static::num_size_classes();
    }
    EvictRandomSizeClass::race_counter = local_18;
  }
  if (local_18 == locked_size_class) {
    force_local = false;
  }
  else {
    pCVar3 = Static::central_cache();
    force_local = ShrinkCache(pCVar3 + (int)local_18,locked_size_class,force);
  }
  return force_local;
}

Assistant:

bool CentralFreeList::EvictRandomSizeClass(
    int locked_size_class, bool force) {
  static int race_counter = 0;
  int t = race_counter++;  // Updated without a lock, but who cares.
  if (t >= Static::num_size_classes()) {
    while (t >= Static::num_size_classes()) {
      t -= Static::num_size_classes();
    }
    race_counter = t;
  }
  ASSERT(t >= 0);
  ASSERT(t < Static::num_size_classes());
  if (t == locked_size_class) return false;
  return Static::central_cache()[t].ShrinkCache(locked_size_class, force);
}